

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slist.c
# Opt level: O2

curl_slist * Curl_slist_duplicate(curl_slist *inlist)

{
  curl_slist *pcVar1;
  curl_slist *list;
  
  list = (curl_slist *)0x0;
  while( true ) {
    if (inlist == (curl_slist *)0x0) {
      return list;
    }
    pcVar1 = curl_slist_append(list,inlist->data);
    if (pcVar1 == (curl_slist *)0x0) break;
    inlist = inlist->next;
    list = pcVar1;
  }
  curl_slist_free_all(list);
  return (curl_slist *)0x0;
}

Assistant:

struct curl_slist *Curl_slist_duplicate(struct curl_slist *inlist)
{
  struct curl_slist *outlist = NULL;
  struct curl_slist *tmp;

  while(inlist) {
    tmp = curl_slist_append(outlist, inlist->data);

    if(!tmp) {
      curl_slist_free_all(outlist);
      return NULL;
    }

    outlist = tmp;
    inlist = inlist->next;
  }
  return outlist;
}